

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::parseTableCreation(Parser *this)

{
  pointer *ppEVar1;
  Token *t;
  Token *t_00;
  int iVar2;
  Node *pNVar3;
  socklen_t *in_RCX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  sockaddr *__addr_05;
  sockaddr *__addr_06;
  sockaddr *extraout_RDX_00;
  TokenType token_type;
  Node *key;
  Node *value;
  ExprContextScope exprContextScope;
  vector<Token_*,_std::allocator<Token_*>_> assignmentTokens;
  vector<Node_*,_std::allocator<Node_*>_> values;
  vector<Node_*,_std::allocator<Node_*>_> keys;
  
  parseTableCreation()::ExprContextScope::ExprContextScope(std::vector<Parser::ExpressionContext,std
  ::allocator<Parser::ExpressionContext>_>__(&exprContextScope,&this->expressionContext);
  t = this->tok;
  keys.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  keys.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  keys.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  values.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  values.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  values.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  assignmentTokens.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  assignmentTokens.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  assignmentTokens.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = accept(this,0x18,__addr,in_RCX);
  if ((char)iVar2 == '\0') {
    __addr_00 = extraout_RDX;
    do {
      key = (Node *)0x0;
      value = (Node *)0x0;
      iVar2 = accept(this,2,__addr_00,in_RCX);
      if ((char)iVar2 == '\0') {
        iVar2 = accept(this,0x19,__addr_01,in_RCX);
        if ((char)iVar2 == '\0') {
          iVar2 = accept(this,3,__addr_03,in_RCX);
          if ((char)iVar2 == '\0') {
            iVar2 = accept(this,0x48,__addr_04,in_RCX);
            if (((char)iVar2 != '\0') &&
               (value = parseFunction(this,FT_FUNCTION), value != (Node *)0x0)) {
              key = *(value->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
            }
            goto LAB_0011022c;
          }
          key = createOperandNode(this,this->tok);
          token_type = TK_COLON;
        }
        else {
          t_00 = this->tok;
          pNVar3 = parseTernaryOp(this);
          key = createMakeKeyNode(this,t_00,pNVar3);
          expect(this,TK_RSQUARE);
          token_type = TK_ASSIGN;
        }
        expect(this,token_type);
      }
      else {
        key = createIdentifierNode(this,this->tok);
        iVar2 = accept(this,6,__addr_02,in_RCX);
        if ((char)iVar2 == '\0') {
          value = createIdentifierNode(this,this->tok);
        }
      }
LAB_0011022c:
      if (((key == (Node *)0x0) || (this->ctx->isError != false)) ||
         ((std::vector<Token_*,_std::allocator<Token_*>_>::push_back(&assignmentTokens,&this->tok),
          value == (Node *)0x0 && (value = parseTernaryOp(this), value == (Node *)0x0)))) {
        pNVar3 = (Node *)0x0;
        goto LAB_0011030c;
      }
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&keys,&key);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&values,&value);
      accept(this,8,__addr_05,in_RCX);
      iVar2 = accept(this,0x18,__addr_06,in_RCX);
      __addr_00 = extraout_RDX_00;
    } while ((char)iVar2 == '\0');
    pNVar3 = createTableCreationNode(this,t,&keys,&values,&assignmentTokens);
  }
  else {
    pNVar3 = createTableCreationNode(this,t,&keys,&values,&assignmentTokens);
  }
LAB_0011030c:
  std::_Vector_base<Token_*,_std::allocator<Token_*>_>::~_Vector_base
            (&assignmentTokens.super__Vector_base<Token_*,_std::allocator<Token_*>_>);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&values.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&keys.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  ppEVar1 = &((exprContextScope.ec)->
             super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  *ppEVar1 = *ppEVar1 + -1;
  return pNVar3;
}

Assistant:

Node * parseTableCreation()
  {
    EXPRESSION_CONTEXT_SCOPE(EC_USUAL);

    Token & opToken = *tok;
    std::vector<Node *> keys;
    std::vector<Node *> values;
    std::vector<Token *> assignmentTokens;

    if (accept(TK_RBRACE))
      return createTableCreationNode(opToken, keys, values, assignmentTokens);

    for (;;)
    {
      Node * key = nullptr;
      Node * value = nullptr;

      if (accept(TK_IDENTIFIER))
      {
        key = createIdentifierNode(*tok);
        if (!accept(TK_ASSIGN))
          value = createIdentifierNode(*tok);
      }
      else if (accept(TK_LSQUARE))
      {
        key = createMakeKeyNode(*tok, parseTernaryOp());
        expect(TK_RSQUARE);
        expect(TK_ASSIGN);
      }
      else if (accept(TK_STRING_LITERAL))
      {
        key = createOperandNode(*tok);
        expect(TK_COLON);
      }
      else if (accept(TK_FUNCTION))
      {
        value = parseFunction(FT_FUNCTION);
        if (value)
          key = value->children[0]; // function name
      }

      if (!key || ctx.isError)
        break;

      assignmentTokens.push_back(tok);

      if (!value)
        value = parseTernaryOp();
      if (!value)
        break;

      keys.push_back(key);
      values.push_back(value);
      accept(TK_COMMA); // optional comma
      if (accept(TK_RBRACE))
        return createTableCreationNode(opToken, keys, values, assignmentTokens);
    }

    return nullptr;
  }